

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O1

void __thiscall
icu_63::number::LocalizedNumberFormatter::getAffixImpl
          (LocalizedNumberFormatter *this,bool isPrefix,bool isNegative,UnicodeString *result,
          UErrorCode *status)

{
  ushort uVar1;
  bool bVar2;
  ushort uVar3;
  int start;
  int32_t iVar4;
  NumberStringBuilder string;
  UnicodeString UStack_1a8;
  UnicodeString local_168;
  NumberStringBuilder local_128;
  
  impl::NumberStringBuilder::NumberStringBuilder(&local_128);
  bVar2 = computeCompiled(this,status);
  if (bVar2) {
    start = impl::NumberFormatterImpl::getPrefixSuffix
                      (this->fCompiled,-isNegative | 1U,OTHER,&local_128,status);
  }
  else {
    start = impl::NumberFormatterImpl::getPrefixSuffixStatic
                      ((MacroProps *)this,-isNegative | 1U,OTHER,&local_128,status);
  }
  uVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
  uVar3 = 2;
  if ((uVar1 & 1) == 0) {
    uVar3 = uVar1 & 0x1e;
  }
  (result->fUnion).fStackFields.fLengthAndFlags = uVar3;
  if (isPrefix) {
    impl::NumberStringBuilder::toTempUnicodeString(&local_168,&local_128);
    UnicodeString::tempSubString(&UStack_1a8,&local_168,0,start);
    if (-1 < UStack_1a8.fUnion.fStackFields.fLengthAndFlags) {
      UStack_1a8.fUnion.fFields.fLength = (int)UStack_1a8.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(result,&UStack_1a8,0,UStack_1a8.fUnion.fFields.fLength);
  }
  else {
    impl::NumberStringBuilder::toTempUnicodeString(&local_168,&local_128);
    iVar4 = impl::NumberStringBuilder::length(&local_128);
    UnicodeString::tempSubString(&UStack_1a8,&local_168,start,iVar4 - start);
    if (-1 < UStack_1a8.fUnion.fStackFields.fLengthAndFlags) {
      UStack_1a8.fUnion.fFields.fLength = (int)UStack_1a8.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(result,&UStack_1a8,0,UStack_1a8.fUnion.fFields.fLength);
  }
  UnicodeString::~UnicodeString(&UStack_1a8);
  UnicodeString::~UnicodeString(&local_168);
  impl::NumberStringBuilder::~NumberStringBuilder(&local_128);
  return;
}

Assistant:

void LocalizedNumberFormatter::getAffixImpl(bool isPrefix, bool isNegative, UnicodeString& result,
                                            UErrorCode& status) const {
    NumberStringBuilder string;
    auto signum = static_cast<int8_t>(isNegative ? -1 : 1);
    // Always return affixes for plural form OTHER.
    static const StandardPlural::Form plural = StandardPlural::OTHER;
    int32_t prefixLength;
    if (computeCompiled(status)) {
        prefixLength = fCompiled->getPrefixSuffix(signum, plural, string, status);
    } else {
        prefixLength = NumberFormatterImpl::getPrefixSuffixStatic(fMacros, signum, plural, string, status);
    }
    result.remove();
    if (isPrefix) {
        result.append(string.toTempUnicodeString().tempSubStringBetween(0, prefixLength));
    } else {
        result.append(string.toTempUnicodeString().tempSubStringBetween(prefixLength, string.length()));
    }
}